

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::RedirectedStreams::~RedirectedStreams(RedirectedStreams *this)

{
  string sStack_38;
  
  ReusableStringStream::str_abi_cxx11_(&sStack_38,&(this->m_redirectedStdOut).m_rss);
  std::__cxx11::string::append((string *)this->m_redirectedCout);
  std::__cxx11::string::~string((string *)&sStack_38);
  ReusableStringStream::str_abi_cxx11_(&sStack_38,&(this->m_redirectedStdErr).m_rss);
  std::__cxx11::string::append((string *)this->m_redirectedCerr);
  std::__cxx11::string::~string((string *)&sStack_38);
  RedirectedStdErr::~RedirectedStdErr(&this->m_redirectedStdErr);
  RedirectedStdOut::~RedirectedStdOut(&this->m_redirectedStdOut);
  return;
}

Assistant:

RedirectedStreams::~RedirectedStreams() {
        m_redirectedCout += m_redirectedStdOut.str();
        m_redirectedCerr += m_redirectedStdErr.str();
    }